

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr-sys-linux.c
# Opt level: O0

int get_topology(msr_topology *topo,uint32_t ncpus)

{
  int iVar1;
  uint local_20;
  uint32_t i;
  uint32_t ncpus_local;
  msr_topology *topo_local;
  
  local_20 = 0;
  while( true ) {
    if (ncpus <= local_20) {
      return 0;
    }
    iVar1 = get_physical_package_id(local_20,&topo[local_20].pkg);
    if (iVar1 < 0) break;
    iVar1 = get_die_id(local_20,&topo[local_20].die);
    if (iVar1 < 0) {
      return -1;
    }
    topo[local_20].cpu = local_20;
    local_20 = local_20 + 1;
  }
  return -1;
}

Assistant:

static int get_topology(msr_topology* topo, uint32_t ncpus) {
  // assumes cpus are numbered from 0 to ncpus-1
  uint32_t i;
  for (i = 0; i < ncpus; i++) {
    if (get_physical_package_id(i, &topo[i].pkg) < 0) {
      return -1;
    }
    if (get_die_id(i, &topo[i].die) < 0) {
      return -1;
    }
    topo[i].cpu = i;
  }
  return 0;
}